

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O1

int choose_new_sa(uint64_t name,int sa)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  
  if (((0xfd < sa) || ((addr[(uint)sa].flags & 1) == 0)) ||
     (addr[(uint)sa].name - 1 < name && addr[(uint)sa].name != name)) {
    piVar4 = &addr[0].flags;
    lVar3 = 0;
    do {
      if (((*piVar4 & 1) != 0) &&
         ((((anon_struct_16_2_f7718127 *)(piVar4 + -2))->name == 0 ||
          (((anon_struct_16_2_f7718127 *)(piVar4 + -2))->name == name)))) {
        return (int)lVar3;
      }
      lVar3 = lVar3 + 1;
      piVar4 = piVar4 + 4;
    } while (lVar3 != 0xfe);
    iVar2 = 0xfe;
    do {
      bVar1 = 0xfc < sa;
      sa = sa + 1;
      if (bVar1) {
        sa = 0;
      }
      if (((addr[sa].flags & 1) != 0) && (name < addr[sa].name)) {
        return sa;
      }
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    sa = 0xfe;
  }
  return sa;
}

Assistant:

static int choose_new_sa(uint64_t name, int sa)
{
	int j, cnt;

	/* test current entry */
	if ((sa < J1939_IDLE_ADDR) && (addr[sa].flags & F_USE)) {
		j = sa;
		if (!addr[j].name || (addr[j].name == name) || (addr[j].name > name))
			return j;
	}
	/* take first empty spot */
	for (j = 0; j < J1939_IDLE_ADDR; ++j) {
		if (!(addr[j].flags & F_USE))
			continue;
		if (!addr[j].name || (addr[j].name == name))
			return j;
	}

	/*
	 * no empty spot found
	 * take next (relative to @sa) spot that we can
	 * successfully contest
	 */
	j = sa + 1;
	for (cnt = 0; cnt < J1939_IDLE_ADDR; ++j, ++cnt) {
		if (j >= J1939_IDLE_ADDR)
			j = 0;
		if (!(addr[j].flags & F_USE))
			continue;
		if (name < addr[j].name)
			return j;
	}
	return J1939_IDLE_ADDR;
}